

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O1

void set_patched_distance(pfdistances_patched *distances,loc_conflict grid,wchar_t distance)

{
  wchar_t wVar1;
  byte bVar2;
  wchar_t wVar3;
  uint uVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  
  if (((((long)grid < 0) || (wVar3 = grid.x, wVar3 < L'\0')) ||
      (wVar1 = grid.y, distances->height <= wVar1)) || (distances->width <= wVar3)) {
    __assert_fail("grid.y >= 0 && grid.y < distances->height && grid.x >= 0 && grid.x < distances->width"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x309,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)")
    ;
  }
  bVar2 = (byte)distances->patch_shift;
  wVar5 = (uint)wVar1 >> (bVar2 & 0x1f);
  if (distances->npatchy <= wVar5) {
    __assert_fail("patchy >= 0 && patchy < distances->npatchy",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x30b,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)")
    ;
  }
  wVar6 = (uint)wVar3 >> (bVar2 & 0x1f);
  if (wVar6 < distances->npatchx) {
    if (distances->patches[(uint)wVar5][(uint)wVar6] == (int *)0x0) {
      __assert_fail("distances->patches[patchy][patchx]",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                    ,0x30e,
                    "void set_patched_distance(struct pfdistances_patched *, struct loc, int)");
    }
    uVar4 = (wVar3 & distances->patch_mask) + ((wVar1 & distances->patch_mask) << (bVar2 & 0x1f));
    if ((-1 < (int)uVar4) && ((int)uVar4 < distances->patch_size * distances->patch_size)) {
      distances->patches[(uint)wVar5][(uint)wVar6][uVar4] = distance;
      return;
    }
    __assert_fail("patchi >= 0 && patchi < distances->patch_size * distances->patch_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                  ,0x312,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)")
    ;
  }
  __assert_fail("patchx >= 0 && patchx < distances->npatchx",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-path.c"
                ,0x30d,"void set_patched_distance(struct pfdistances_patched *, struct loc, int)");
}

Assistant:

static void set_patched_distance(struct pfdistances_patched *distances,
		struct loc grid, int distance)
{
	int patchy, patchx, patchi;

	assert(grid.y >= 0 && grid.y < distances->height
		&& grid.x >= 0 && grid.x < distances->width);
	patchy = grid.y >> distances->patch_shift;
	assert(patchy >= 0 && patchy < distances->npatchy);
	patchx = grid.x >> distances->patch_shift;
	assert(patchx >= 0 && patchx < distances->npatchx);
	assert(distances->patches[patchy][patchx]);
	patchi = ((grid.y & distances->patch_mask) << distances->patch_shift)
		+ (grid.x & distances->patch_mask);
	assert(patchi >= 0 && patchi < distances->patch_size
		* distances->patch_size);
	distances->patches[patchy][patchx][patchi] = distance;
}